

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall
bdNode::msgin_post_hash
          (bdNode *this,bdId *id,bdToken *transId,bdNodeId *info_hash,uint32_t port,bdToken *token)

{
  bdToken *token_local;
  uint32_t port_local;
  bdNodeId *info_hash_local;
  bdToken *transId_local;
  bdId *id_local;
  bdNode *this_local;
  
  bdAccount::incCounter(&this->mAccount,7,false);
  return;
}

Assistant:

void bdNode::msgin_post_hash(bdId *id,  bdToken *transId,  bdNodeId *info_hash,  uint32_t port, bdToken *token) {

	mAccount.incCounter(BDACCOUNT_MSG_POSTHASH, false);

#ifdef DEBUG_NODE_MSGIN
	std::cerr << "bdNode::msgin_post_hash() TransId: ";
	bdPrintTransId(std::cerr, transId);
	std::cerr << " From: ";
	mFns->bdPrintId(std::cerr, id);
	std::cerr << " Info_Hash: ";
	mFns->bdPrintNodeId(std::cerr, info_hash);
	std::cerr << " Port: " << port;
	std::cerr << " Token: ";
	bdPrintToken(std::cerr, token);
	std::cerr << std::endl;
#else
	(void) id;
	(void) transId;
	(void) info_hash;
	(void) port;
	(void) token;
#endif

}